

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cpp
# Opt level: O0

void __thiscall miniros::Publisher::Impl::unadvertise(Impl *this)

{
  bool bVar1;
  long in_RDI;
  TopicManagerPtr tm;
  SubscriberCallbacksPtr *in_stack_00000078;
  string *in_stack_00000080;
  TopicManager *in_stack_00000088;
  NodeHandle *in_stack_ffffffffffffffd8;
  __shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffe0;
  __shared_ptr local_18 [24];
  
  if ((*(byte *)(in_RDI + 0x80) & 1) == 0) {
    *(undefined1 *)(in_RDI + 0x80) = 1;
    std::__shared_ptr_access<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x492445);
    NodeHandle::getTopicManager(in_stack_ffffffffffffffd8);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_18);
    if (bVar1) {
      std::__shared_ptr_access<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x49246c);
      TopicManager::unadvertise(in_stack_00000088,in_stack_00000080,in_stack_00000078);
    }
    std::__shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>::reset
              (in_stack_ffffffffffffffe0);
    std::shared_ptr<miniros::TopicManager>::~shared_ptr
              ((shared_ptr<miniros::TopicManager> *)0x4924b6);
  }
  return;
}

Assistant:

void Publisher::Impl::unadvertise()
{
  if (!unadvertised_)
  {
    unadvertised_ = true;
    TopicManagerPtr tm = node_handle_->getTopicManager();
    if (tm)
      tm->unadvertise(topic_, callbacks_);
    node_handle_.reset();
  }
}